

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O3

int __thiscall OpenMD::Rattle::constraintPairB(Rattle *this,ConstraintPair *consPair)

{
  double *pdVar1;
  ConstraintElem *pCVar2;
  ConstraintElem *pCVar3;
  StuntDouble *pSVar4;
  DataStoragePointer DVar5;
  Snapshot *pSVar6;
  DataStoragePointer DVar7;
  Snapshot *pSVar8;
  StuntDouble *pSVar9;
  uint i_1;
  int iVar10;
  long lVar11;
  long lVar12;
  uint i;
  long lVar13;
  double tmp_1;
  double tmp;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_6;
  Vector<double,_3U> result;
  double local_138 [4];
  double local_118 [4];
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [4];
  Vector3d local_98;
  double local_78 [4];
  double local_58 [4];
  double local_38 [3];
  
  pCVar2 = consPair->consElem1_;
  pCVar3 = consPair->consElem2_;
  pSVar4 = pCVar2->sd_;
  DVar5 = pSVar4->storage_;
  pSVar6 = pSVar4->snapshotMan_->currentSnapshot_;
  lVar11 = (long)pSVar4->localIndex_;
  lVar13 = *(long *)((long)&(pSVar6->atomData).velocity.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data + DVar5);
  local_f8[2] = (double)*(undefined8 *)(lVar13 + 0x10 + lVar11 * 0x18);
  pdVar1 = (double *)(lVar13 + lVar11 * 0x18);
  local_f8[0] = *pdVar1;
  local_f8[1] = pdVar1[1];
  pSVar4 = pCVar3->sd_;
  DVar7 = pSVar4->storage_;
  pSVar8 = pSVar4->snapshotMan_->currentSnapshot_;
  lVar12 = (long)pSVar4->localIndex_;
  lVar13 = *(long *)((long)&(pSVar8->atomData).velocity.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar7);
  local_118[2] = (double)*(undefined8 *)(lVar13 + 0x10 + lVar12 * 0x18);
  pdVar1 = (double *)(lVar13 + lVar12 * 0x18);
  local_118[0] = *pdVar1;
  local_118[1] = pdVar1[1];
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  lVar13 = 0;
  do {
    local_78[lVar13] = local_f8[lVar13] - local_118[lVar13];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  lVar13 = *(long *)((long)&(pSVar6->atomData).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data + DVar5);
  local_38[2] = (double)*(undefined8 *)(lVar13 + 0x10 + lVar11 * 0x18);
  pdVar1 = (double *)(lVar13 + lVar11 * 0x18);
  local_38[0] = *pdVar1;
  local_38[1] = pdVar1[1];
  lVar13 = *(long *)((long)&(pSVar8->atomData).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar7);
  local_58[2] = (double)*(undefined8 *)(lVar13 + 0x10 + lVar12 * 0x18);
  pdVar1 = (double *)(lVar13 + lVar12 * 0x18);
  local_58[0] = *pdVar1;
  local_58[1] = pdVar1[1];
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar13 = 0;
  do {
    local_138[lVar13] = local_38[lVar13] - local_58[lVar13];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  local_98.super_Vector<double,_3U>.data_[2] = local_138[2];
  local_98.super_Vector<double,_3U>.data_[0] = local_138[0];
  local_98.super_Vector<double,_3U>.data_[1] = local_138[1];
  Snapshot::wrapVector(this->currentSnapshot_,&local_98);
  pSVar4 = pCVar2->sd_;
  pSVar9 = pCVar3->sd_;
  dVar14 = 0.0;
  lVar13 = 0;
  do {
    dVar14 = dVar14 + local_98.super_Vector<double,_3U>.data_[lVar13] * local_78[lVar13];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  auVar15._8_8_ = pSVar9->mass_;
  auVar15._0_8_ = pSVar4->mass_;
  auVar15 = divpd(_DAT_002988f0,auVar15);
  dVar14 = -dVar14 / ((auVar15._0_8_ + auVar15._8_8_) * consPair->dist2);
  dVar16 = ABS(dVar14);
  iVar10 = 1;
  if (this->consTolerance_ <= dVar16 && dVar16 != this->consTolerance_) {
    local_d8[0] = 0.0;
    local_d8[1] = 0.0;
    local_d8[2] = 0.0;
    lVar13 = 0;
    do {
      local_d8[lVar13] = local_98.super_Vector<double,_3U>.data_[lVar13] * dVar14;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar13 = 0;
    do {
      local_138[lVar13] = local_d8[lVar13] * auVar15._0_8_;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    lVar13 = 0;
    do {
      local_f8[lVar13] = local_138[lVar13] + local_f8[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    iVar10 = pSVar4->localIndex_;
    lVar13 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data + pSVar4->storage_);
    *(double *)(lVar13 + 0x10 + (long)iVar10 * 0x18) = local_f8[2];
    pdVar1 = (double *)(lVar13 + (long)iVar10 * 0x18);
    *pdVar1 = local_f8[0];
    pdVar1[1] = local_f8[1];
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar13 = 0;
    do {
      local_138[lVar13] = local_d8[lVar13] * auVar15._8_8_;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    lVar13 = 0;
    do {
      local_118[lVar13] = local_118[lVar13] - local_138[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    iVar10 = pSVar9->localIndex_;
    lVar13 = *(long *)((long)&(pSVar9->snapshotMan_->currentSnapshot_->atomData).velocity.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + pSVar9->storage_);
    *(double *)(lVar13 + 0x10 + (long)iVar10 * 0x18) = local_118[2];
    pdVar1 = (double *)(lVar13 + (long)iVar10 * 0x18);
    *pdVar1 = local_118[0];
    pdVar1[1] = local_118[1];
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    lVar13 = 0;
    do {
      local_138[lVar13] = local_d8[lVar13] + local_d8[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    dVar14 = this->dt_;
    local_b8[0] = 0.0;
    local_b8[1] = 0.0;
    local_b8[2] = 0.0;
    lVar13 = 0;
    do {
      local_b8[lVar13] = local_138[lVar13] / dVar14;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    dVar14 = 0.0;
    lVar13 = 0;
    do {
      dVar14 = dVar14 + local_b8[lVar13] * local_b8[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    dVar16 = 0.0;
    lVar13 = 0;
    do {
      dVar16 = dVar16 + local_b8[lVar13] * local_98.super_Vector<double,_3U>.data_[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    consPair->force_ =
         (double)((ulong)ABS(dVar14) | (ulong)dVar16 & 0x8000000000000000) + consPair->force_;
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int Rattle::constraintPairB(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d velA = consElem1->getVel();
    Vector3d velB = consElem2->getVel();

    Vector3d dv = velA - velB;

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d rab = posA - posB;

    currentSnapshot_->wrapVector(rab);

    RealType rma = 1.0 / consElem1->getMass();
    RealType rmb = 1.0 / consElem2->getMass();

    RealType rvab = dot(rab, dv);

    RealType gab = -rvab / ((rma + rmb) * consPair->getConsDistSquare());

    if (fabs(gab) > consTolerance_) {
      Vector3d delta = rab * gab;
      velA += rma * delta;
      consElem1->setVel(velA);

      velB -= rmb * delta;
      consElem2->setVel(velB);

      // report the constraint force back to the constraint pair:

      Vector3d fcons = 2.0 * delta / dt_;
      RealType proj  = copysign(fcons.length(), dot(fcons, rab));

      consPair->addConstraintForce(proj);
      return consSuccess;
    } else {
      return consAlready;
    }
  }